

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void __thiscall Map::Map(Map *this,Map *map)

{
  pointer ppEVar1;
  Entity *pEVar2;
  Blockset *pBVar3;
  Entity *pEVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint16_t uVar8;
  undefined1 uVar9;
  undefined4 uVar10;
  Position PVar11;
  uint8_t uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  Entity *pEVar19;
  pointer ppEVar20;
  Entity *local_38;
  
  this->_id = map->_id;
  pBVar3 = map->_blockset;
  this->_layout = map->_layout;
  this->_blockset = pBVar3;
  this->_palette = map->_palette;
  uVar5 = map->_background_music;
  uVar6 = map->_unknown_param_1;
  uVar7 = map->_unknown_param_2;
  this->_room_height = map->_room_height;
  this->_background_music = uVar5;
  this->_unknown_param_1 = uVar6;
  this->_unknown_param_2 = uVar7;
  this->_base_chest_id = map->_base_chest_id;
  uVar8 = map->_climb_destination;
  this->_fall_destination = map->_fall_destination;
  this->_climb_destination = uVar8;
  (this->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Rb_tree<Map_*,_std::pair<Map_*const,_Flag>,_std::_Select1st<std::pair<Map_*const,_Flag>_>,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_>
  ::_Rb_tree(&(this->_variants)._M_t,&(map->_variants)._M_t);
  this->_parent_map = map->_parent_map;
  (this->_speaker_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_speaker_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_speaker_ids).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::vector
            (&this->_global_entity_mask_flags,&map->_global_entity_mask_flags);
  (this->_key_door_mask_flags).
  super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_key_door_mask_flags).
  super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_key_door_mask_flags).
  super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_visited_flag)._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  (this->_visited_flag).byte = 0;
  (this->_visited_flag).bit = '\0';
  this->_map_setup_addr = 0xffffffff;
  this->_map_update_addr = 0xffffffff;
  ppEVar20 = (map->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppEVar1 = (map->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar20 != ppEVar1) {
    do {
      pEVar2 = *ppEVar20;
      pEVar19 = (Entity *)operator_new(0x58);
      uVar5 = (pEVar2->_attrs).type_id;
      PVar11 = (pEVar2->_attrs).position;
      uVar6 = (pEVar2->_attrs).orientation;
      uVar7 = (pEVar2->_attrs).palette;
      uVar12 = (pEVar2->_attrs).speed;
      bVar13 = (pEVar2->_attrs).fightable;
      bVar14 = (pEVar2->_attrs).liftable;
      bVar15 = (pEVar2->_attrs).can_pass_through;
      bVar16 = (pEVar2->_attrs).appear_after_player_moved_away;
      bVar17 = (pEVar2->_attrs).gravity_immune;
      bVar18 = (pEVar2->_attrs).talkable;
      uVar9 = (pEVar2->_attrs).field_0x11;
      uVar8 = (pEVar2->_attrs).behavior_id;
      uVar10 = *(undefined4 *)&(pEVar2->_attrs).field_0x14;
      pEVar4 = (pEVar2->_attrs).entity_to_use_tiles_from;
      (pEVar19->_attrs).dialogue = (pEVar2->_attrs).dialogue;
      (pEVar19->_attrs).field_0x11 = uVar9;
      (pEVar19->_attrs).behavior_id = uVar8;
      *(undefined4 *)&(pEVar19->_attrs).field_0x14 = uVar10;
      (pEVar19->_attrs).entity_to_use_tiles_from = pEVar4;
      (pEVar19->_attrs).type_id = uVar5;
      (pEVar19->_attrs).position = PVar11;
      (pEVar19->_attrs).orientation = uVar6;
      (pEVar19->_attrs).palette = uVar7;
      (pEVar19->_attrs).speed = uVar12;
      (pEVar19->_attrs).fightable = bVar13;
      (pEVar19->_attrs).liftable = bVar14;
      (pEVar19->_attrs).can_pass_through = bVar15;
      (pEVar19->_attrs).appear_after_player_moved_away = bVar16;
      (pEVar19->_attrs).gravity_immune = bVar17;
      (pEVar19->_attrs).talkable = bVar18;
      std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector
                (&(pEVar19->_attrs).mask_flags,&(pEVar2->_attrs).mask_flags);
      (pEVar19->_attrs).persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898
      ;
      (pEVar19->_attrs).persistence_flag.byte = (pEVar2->_attrs).persistence_flag.byte;
      (pEVar19->_attrs).persistence_flag.bit = (pEVar2->_attrs).persistence_flag.bit;
      bVar13 = (pEVar2->_attrs).flag_unknown_2_4;
      (pEVar19->_attrs).flag_unknown_2_3 = (pEVar2->_attrs).flag_unknown_2_3;
      (pEVar19->_attrs).flag_unknown_2_4 = bVar13;
      (pEVar19->_attrs).flag_unknown_3_5 = (pEVar2->_attrs).flag_unknown_3_5;
      pEVar19->_map = this;
      local_38 = pEVar19;
      std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*&>
                ((vector<Entity*,std::allocator<Entity*>> *)&this->_entities,&local_38);
      ppEVar20 = ppEVar20 + 1;
    } while (ppEVar20 != ppEVar1);
  }
  return;
}

Assistant:

Map::Map(const Map& map) :
    _id                         (map._id),
    _layout                     (map._layout),
    _blockset                   (map._blockset),
    _palette                    (map._palette),
    _room_height                (map._room_height),
    _background_music           (map._background_music),
    _unknown_param_1            (map._unknown_param_1),
    _unknown_param_2            (map._unknown_param_2),
    _base_chest_id              (map._base_chest_id),
    _fall_destination           (map._fall_destination),
    _climb_destination          (map._climb_destination),
    _parent_map                 (map._parent_map),
    _variants                   (map._variants),
    _global_entity_mask_flags   (map._global_entity_mask_flags)
{
    for(Entity* entity : map._entities)
        this->add_entity(new Entity(*entity));
}